

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitSelect(BinaryInstWriter *this,Select *curr)

{
  WasmBinaryWriter *this_00;
  ulong uVar1;
  bool bVar2;
  BufferWithRandomAccess *this_01;
  size_t sVar3;
  BasicType local_34;
  Type local_30;
  ulong local_28;
  size_t i;
  Select *local_18;
  Select *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (Select *)this;
  bVar2 = wasm::Type::isRef(&(curr->super_SpecificExpression<(wasm::Expression::Id)17>).
                             super_Expression.type);
  if (bVar2) {
    this_01 = BufferWithRandomAccess::operator<<(this->o,'\x1c');
    sVar3 = wasm::Type::size(&(local_18->super_SpecificExpression<(wasm::Expression::Id)17>).
                              super_Expression.type);
    LEB<unsigned_int,_unsigned_char>::LEB
              ((LEB<unsigned_int,_unsigned_char> *)((long)&i + 4),(uint)sVar3);
    BufferWithRandomAccess::operator<<(this_01,i._4_4_);
    for (local_28 = 0; uVar1 = local_28,
        sVar3 = wasm::Type::size(&(local_18->super_SpecificExpression<(wasm::Expression::Id)17>).
                                  super_Expression.type), uVar1 < sVar3; local_28 = local_28 + 1) {
      this_00 = this->parent;
      local_34 = unreachable;
      bVar2 = wasm::Type::operator!=
                        (&(local_18->super_SpecificExpression<(wasm::Expression::Id)17>).
                          super_Expression.type,&local_34);
      if (bVar2) {
        local_30.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)17>).
                      super_Expression.type.id;
      }
      else {
        wasm::Type::Type(&local_30,none);
      }
      WasmBinaryWriter::writeType(this_00,local_30);
    }
  }
  else {
    BufferWithRandomAccess::operator<<(this->o,'\x1b');
  }
  return;
}

Assistant:

void BinaryInstWriter::visitSelect(Select* curr) {
  if (curr->type.isRef()) {
    o << int8_t(BinaryConsts::SelectWithType) << U32LEB(curr->type.size());
    for (size_t i = 0; i < curr->type.size(); i++) {
      parent.writeType(curr->type != Type::unreachable ? curr->type
                                                       : Type::none);
    }
  } else {
    o << int8_t(BinaryConsts::Select);
  }
}